

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool IsVirtualFunctionCall(ExpressionContext *ctx,FunctionData *function,TypeBase *type)

{
  uint uVar1;
  uint uVar2;
  TypeRef *pTVar3;
  TypeClass *classType_00;
  InplaceStr IVar4;
  char *local_50;
  InplaceStr constructor;
  uint hash;
  TypeClass *classType;
  TypeRef *refType;
  TypeBase *type_local;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  
  if (function != (FunctionData *)0x0) {
    if ((TypeStruct *)type == ctx->typeAutoRef) {
      ctx_local._7_1_ = true;
    }
    else {
      pTVar3 = getType<TypeRef>(type);
      if (((pTVar3 == (TypeRef *)0x0) ||
          (classType_00 = getType<TypeClass>(pTVar3->subType), classType_00 == (TypeClass *)0x0)) ||
         (((classType_00->extendable & 1U) == 0 && (classType_00->baseClass == (TypeClass *)0x0))))
      {
        ctx_local._7_1_ = false;
      }
      else {
        uVar2 = NULLC::StringHashContinue
                          ((classType_00->super_TypeStruct).super_TypeBase.nameHash,"::");
        IVar4 = GetTypeConstructorName(classType_00);
        local_50 = IVar4.begin;
        constructor.begin = IVar4.end;
        uVar2 = NULLC::StringHashContinue(uVar2,local_50,constructor.begin);
        if ((function->nameHash == uVar2) ||
           (uVar1 = function->nameHash, uVar2 = NULLC::StringHashContinue(uVar2,"$"), uVar1 == uVar2
           )) {
          ctx_local._7_1_ = false;
        }
        else {
          ctx_local._7_1_ = true;
        }
      }
    }
    return ctx_local._7_1_;
  }
  __assert_fail("function",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x19ba,
                "bool IsVirtualFunctionCall(ExpressionContext &, FunctionData *, TypeBase *)");
}

Assistant:

bool IsVirtualFunctionCall(ExpressionContext &ctx, FunctionData *function, TypeBase *type)
{
	assert(function);

	if(type == ctx.typeAutoRef)
		return true;

	if(TypeRef *refType = getType<TypeRef>(type))
	{
		if(TypeClass *classType = getType<TypeClass>(refType->subType))
		{
			if(classType->extendable || classType->baseClass != NULL)
			{
				unsigned hash = NULLC::StringHashContinue(classType->nameHash, "::");

				InplaceStr constructor = GetTypeConstructorName(classType);

				hash = NULLC::StringHashContinue(hash, constructor.begin, constructor.end);

				if(function->nameHash == hash || function->nameHash == NULLC::StringHashContinue(hash, "$"))
					return false;

				return true;
			}
		}
	}

	return false;
}